

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O3

void __thiscall
Map::Map(Map *this,string *mapTitle,
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        *ctd)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  pointer pcVar3;
  pointer pbVar4;
  char *__nptr;
  string *psVar5;
  vector<Map::Continent_*,_std::allocator<Map::Continent_*>_> *pvVar6;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar7;
  Continent *this_00;
  int *piVar8;
  long lVar9;
  undefined8 uVar10;
  pointer pvVar11;
  string local_70;
  pointer local_50;
  vector<Map::Continent*,std::allocator<Map::Continent*>> *local_48;
  Continent *local_40;
  char *local_38;
  
  psVar5 = (string *)operator_new(0x20);
  (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
  pcVar3 = (mapTitle->_M_dataplus)._M_p;
  paVar1 = &mapTitle->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar10 = *(undefined8 *)((long)&mapTitle->field_2 + 8);
    (psVar5->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&psVar5->field_2 + 8) = uVar10;
  }
  else {
    (psVar5->_M_dataplus)._M_p = pcVar3;
    (psVar5->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  psVar5->_M_string_length = mapTitle->_M_string_length;
  (mapTitle->_M_dataplus)._M_p = (pointer)paVar1;
  mapTitle->_M_string_length = 0;
  (mapTitle->field_2)._M_local_buf[0] = '\0';
  this->pMapTitle = psVar5;
  pvVar6 = (vector<Map::Continent_*,_std::allocator<Map::Continent_*>_> *)operator_new(0x18);
  (pvVar6->super__Vector_base<Map::Continent_*,_std::allocator<Map::Continent_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar6->super__Vector_base<Map::Continent_*,_std::allocator<Map::Continent_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar6->super__Vector_base<Map::Continent_*,_std::allocator<Map::Continent_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->pMapContinents = pvVar6;
  pvVar7 = (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)operator_new(0x18);
  (pvVar7->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar7->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar7->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->pMapCountries = pvVar7;
  pvVar11 = (ctd->
            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_50 = (ctd->
             super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar11 != local_50) {
    do {
      local_48 = (vector<Map::Continent*,std::allocator<Map::Continent*>> *)this->pMapContinents;
      this_00 = (Continent *)operator_new(0x18);
      pbVar4 = (pvVar11->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pcVar3 = (pbVar4->_M_dataplus)._M_p;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar3,pcVar3 + pbVar4->_M_string_length);
      __nptr = (pvVar11->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
      piVar8 = __errno_location();
      iVar2 = *piVar8;
      *piVar8 = 0;
      lVar9 = strtol(__nptr,&local_38,10);
      if (local_38 == __nptr) {
        std::__throw_invalid_argument("stoi");
LAB_0010bf57:
        uVar10 = std::__throw_out_of_range("stoi");
        operator_delete(this_00,0x18);
        _Unwind_Resume(uVar10);
      }
      if (((int)lVar9 != lVar9) || (*piVar8 == 0x22)) goto LAB_0010bf57;
      if (*piVar8 == 0) {
        *piVar8 = iVar2;
      }
      Continent::Continent(this_00,&local_70,(int)lVar9);
      local_40 = this_00;
      std::vector<Map::Continent*,std::allocator<Map::Continent*>>::emplace_back<Map::Continent*>
                (local_48,&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      pvVar11 = pvVar11 + 1;
    } while (pvVar11 != local_50);
  }
  return;
}

Assistant:

Map::Map(std::string mapTitle, std::vector<std::vector<std::string>> ctd) {
    pMapTitle = new std::string(std::move(mapTitle));
    pMapContinents = new std::vector<Continent*>;
    pMapCountries = new std::vector<Country*>;
    //create empty continents
    for (auto& i : ctd) {
        //The map class stores a vector of pointers to Continents, this is essentially a vector containing all the subgraphs of the map
        pMapContinents->push_back(new Continent(i[0], std::stoi(i[1])));
    }
}